

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_js_generator.cc
# Opt level: O0

void __thiscall
t_js_generator::generate_js_struct_reader(t_js_generator *this,ostream *out,t_struct *tstruct)

{
  t_field *tfield;
  bool bVar1;
  int iVar2;
  int32_t iVar3;
  ostream *poVar4;
  t_program *p;
  undefined4 extraout_var;
  reference pptVar5;
  t_type *type;
  size_type sVar6;
  string local_f8;
  string local_d8;
  allocator local_b1;
  string local_b0;
  string local_90;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_70;
  t_field **local_68;
  string local_50;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_30;
  const_iterator f_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *fields;
  t_struct *tstruct_local;
  ostream *out_local;
  t_js_generator *this_local;
  
  f_iter._M_current = (t_field **)t_struct::get_members(tstruct);
  __gnu_cxx::
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
  __normal_iterator(&local_30);
  if ((this->gen_es6_ & 1U) == 0) {
    poVar4 = t_generator::indent((t_generator *)this,out);
    p = t_type::get_program(&tstruct->super_t_type);
    js_namespace_abi_cxx11_(&local_50,this,p);
    poVar4 = std::operator<<(poVar4,(string *)&local_50);
    iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
    poVar4 = std::operator<<(poVar4,(string *)CONCAT44(extraout_var,iVar2));
    poVar4 = std::operator<<(poVar4,".prototype.read = function(input) {");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_50);
  }
  else {
    poVar4 = t_generator::indent((t_generator *)this,out);
    poVar4 = std::operator<<(poVar4,"read (input) {");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  }
  t_generator::indent_up((t_generator *)this);
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::operator<<(poVar4,"input.readStructBegin();");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::operator<<(poVar4,"while (true) {");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_up((t_generator *)this);
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::operator<<(poVar4,(string *)&this->js_const_type_);
  poVar4 = std::operator<<(poVar4,"ret = input.readFieldBegin();");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::operator<<(poVar4,(string *)&this->js_const_type_);
  poVar4 = std::operator<<(poVar4,"ftype = ret.ftype;");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  bVar1 = std::vector<t_field_*,_std::allocator<t_field_*>_>::empty
                    ((vector<t_field_*,_std::allocator<t_field_*>_> *)f_iter._M_current);
  if (!bVar1) {
    poVar4 = t_generator::indent((t_generator *)this,out);
    poVar4 = std::operator<<(poVar4,(string *)&this->js_const_type_);
    poVar4 = std::operator<<(poVar4,"fid = ret.fid;");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  }
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::operator<<(poVar4,"if (ftype == Thrift.Type.STOP) {");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_up((t_generator *)this);
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::operator<<(poVar4,"break;");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_down((t_generator *)this);
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::operator<<(poVar4,"}");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  bVar1 = std::vector<t_field_*,_std::allocator<t_field_*>_>::empty
                    ((vector<t_field_*,_std::allocator<t_field_*>_> *)f_iter._M_current);
  if (bVar1) {
    poVar4 = t_generator::indent((t_generator *)this,out);
    poVar4 = std::operator<<(poVar4,"input.skip(ftype);");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  }
  else {
    poVar4 = t_generator::indent((t_generator *)this,out);
    poVar4 = std::operator<<(poVar4,"switch (fid) {");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_up((t_generator *)this);
    local_68 = (t_field **)
               std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(f_iter._M_current);
    local_30._M_current = local_68;
    while( true ) {
      local_70._M_current =
           (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(f_iter._M_current);
      bVar1 = __gnu_cxx::operator!=(&local_30,&local_70);
      if (!bVar1) break;
      poVar4 = t_generator::indent((t_generator *)this,out);
      poVar4 = std::operator<<(poVar4,"case ");
      pptVar5 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&local_30);
      iVar3 = t_field::get_key(*pptVar5);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
      poVar4 = std::operator<<(poVar4,":");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      poVar4 = t_generator::indent((t_generator *)this,out);
      poVar4 = std::operator<<(poVar4,"if (ftype == ");
      pptVar5 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&local_30);
      type = t_field::get_type(*pptVar5);
      type_to_enum_abi_cxx11_(&local_90,this,type);
      poVar4 = std::operator<<(poVar4,(string *)&local_90);
      poVar4 = std::operator<<(poVar4,") {");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_90);
      t_generator::indent_up((t_generator *)this);
      pptVar5 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&local_30);
      tfield = *pptVar5;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_b0,"this.",&local_b1);
      generate_deserialize_field(this,out,tfield,&local_b0,false);
      std::__cxx11::string::~string((string *)&local_b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_b1);
      t_generator::indent_down((t_generator *)this);
      poVar4 = t_generator::indent((t_generator *)this,out);
      poVar4 = std::operator<<(poVar4,"} else {");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      poVar4 = t_generator::indent((t_generator *)this,out);
      poVar4 = std::operator<<(poVar4,"  input.skip(ftype);");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_d8,(t_generator *)this);
      poVar4 = std::operator<<(out,(string *)&local_d8);
      poVar4 = std::operator<<(poVar4,"}");
      poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_f8,(t_generator *)this);
      poVar4 = std::operator<<(poVar4,(string *)&local_f8);
      poVar4 = std::operator<<(poVar4,"break;");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_d8);
      __gnu_cxx::
      __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
      operator++(&local_30);
    }
    sVar6 = std::vector<t_field_*,_std::allocator<t_field_*>_>::size
                      ((vector<t_field_*,_std::allocator<t_field_*>_> *)f_iter._M_current);
    if (sVar6 == 1) {
      poVar4 = t_generator::indent((t_generator *)this,out);
      poVar4 = std::operator<<(poVar4,"case 0:");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      poVar4 = t_generator::indent((t_generator *)this,out);
      poVar4 = std::operator<<(poVar4,"  input.skip(ftype);");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      poVar4 = t_generator::indent((t_generator *)this,out);
      poVar4 = std::operator<<(poVar4,"  break;");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    }
    poVar4 = t_generator::indent((t_generator *)this,out);
    poVar4 = std::operator<<(poVar4,"default:");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    poVar4 = t_generator::indent((t_generator *)this,out);
    poVar4 = std::operator<<(poVar4,"  input.skip(ftype);");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_oop_generator::scope_down(&this->super_t_oop_generator,out);
  }
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::operator<<(poVar4,"input.readFieldEnd();");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_oop_generator::scope_down(&this->super_t_oop_generator,out);
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::operator<<(poVar4,"input.readStructEnd();");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::operator<<(poVar4,"return;");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_down((t_generator *)this);
  if ((this->gen_es6_ & 1U) == 0) {
    poVar4 = t_generator::indent((t_generator *)this,out);
    poVar4 = std::operator<<(poVar4,"};");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  }
  else {
    poVar4 = t_generator::indent((t_generator *)this,out);
    poVar4 = std::operator<<(poVar4,"}");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  }
  return;
}

Assistant:

void t_js_generator::generate_js_struct_reader(ostream& out, t_struct* tstruct) {
  const vector<t_field*>& fields = tstruct->get_members();
  vector<t_field*>::const_iterator f_iter;

  if (gen_es6_) {
    indent(out) << "read (input) {" << endl;
  } else {
    indent(out) << js_namespace(tstruct->get_program()) << tstruct->get_name()
        << ".prototype.read = function(input) {" << endl;
  }

  indent_up();

  indent(out) << "input.readStructBegin();" << endl;

  // Loop over reading in fields
  indent(out) << "while (true) {" << endl;

  indent_up();

  indent(out) << js_const_type_ << "ret = input.readFieldBegin();" << endl;
  indent(out) << js_const_type_ << "ftype = ret.ftype;" << endl;
  if (!fields.empty()) {
    indent(out) << js_const_type_ << "fid = ret.fid;" << endl;
  }

  // Check for field STOP marker and break
  indent(out) << "if (ftype == Thrift.Type.STOP) {" << endl;
  indent_up();
  indent(out) << "break;" << endl;
  indent_down();
  indent(out) << "}" << endl;
  if (!fields.empty()) {
    // Switch statement on the field we are reading
    indent(out) << "switch (fid) {" << endl;

    indent_up();

    // Generate deserialization code for known cases
    for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {

      indent(out) << "case " << (*f_iter)->get_key() << ":" << endl;
      indent(out) << "if (ftype == " << type_to_enum((*f_iter)->get_type()) << ") {" << endl;

      indent_up();
      generate_deserialize_field(out, *f_iter, "this.");
      indent_down();

      indent(out) << "} else {" << endl;

      indent(out) << "  input.skip(ftype);" << endl;

      out << indent() << "}" << endl << indent() << "break;" << endl;
    }
    if (fields.size() == 1) {
      // pseudo case to make jslint happy
      indent(out) << "case 0:" << endl;
      indent(out) << "  input.skip(ftype);" << endl;
      indent(out) << "  break;" << endl;
    }
    // In the default case we skip the field
    indent(out) << "default:" << endl;
    indent(out) << "  input.skip(ftype);" << endl;

    scope_down(out);
  } else {
    indent(out) << "input.skip(ftype);" << endl;
  }

  indent(out) << "input.readFieldEnd();" << endl;

  scope_down(out);

  indent(out) << "input.readStructEnd();" << endl;

  indent(out) << "return;" << endl;

  indent_down();

  if (gen_es6_) {
    indent(out) << "}" << endl << endl;
  } else {
    indent(out) << "};" << endl << endl;
  }
}